

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

void prepdelem(rnndb *db,rnndelem *elem,char *prefix,rnnvarinfo *parvi,int width)

{
  rnnvarinfo *vi;
  int iVar1;
  rnngroup **pprVar2;
  int iVar3;
  rnndelem **pprVar4;
  rnndelem *prVar5;
  char *pcVar6;
  rnngroup *prVar7;
  long lVar8;
  
  if (elem->type == RNN_ETYPE_USE_GROUP) {
    iVar1 = db->groupsnum;
    if (0 < (long)iVar1) {
      pprVar2 = db->groups;
      pcVar6 = elem->name;
      lVar8 = 0;
      do {
        prVar7 = pprVar2[lVar8];
        iVar3 = strcmp(prVar7->name,pcVar6);
        if (iVar3 == 0) goto LAB_001066e3;
        lVar8 = lVar8 + 1;
      } while (iVar1 != lVar8);
    }
    prVar7 = (rnngroup *)0x0;
LAB_001066e3:
    if (prVar7 == (rnngroup *)0x0) {
      fprintf(_stderr,"group %s not found!\n",elem->name);
      db->estatus = 1;
    }
    else if (0 < prVar7->subelemsnum) {
      lVar8 = 0;
      do {
        iVar1 = elem->subelemsmax;
        if (iVar1 <= elem->subelemsnum) {
          iVar3 = iVar1 * 2;
          if (iVar1 == 0) {
            iVar3 = 0x10;
          }
          elem->subelemsmax = iVar3;
          pprVar4 = (rnndelem **)realloc(elem->subelems,(long)iVar3 << 3);
          elem->subelems = pprVar4;
        }
        prVar5 = copydelem(prVar7->subelems[lVar8],elem->file);
        iVar1 = elem->subelemsnum;
        elem->subelemsnum = iVar1 + 1;
        elem->subelems[iVar1] = prVar5;
        lVar8 = lVar8 + 1;
      } while (lVar8 < prVar7->subelemsnum);
    }
    elem->type = RNN_ETYPE_STRIPE;
    elem->length = 1;
    elem->name = (char *)0x0;
  }
  if (elem->name != (char *)0x0) {
    pcVar6 = catstr(prefix,elem->name);
    elem->fullname = pcVar6;
  }
  pcVar6 = elem->fullname;
  if (elem->fullname == (char *)0x0) {
    pcVar6 = prefix;
  }
  vi = &elem->varinfo;
  prepvarinfo(db,pcVar6,vi,parvi);
  if ((elem->varinfo).dead == 0) {
    if ((elem->length != 1) && (elem->stride == 0)) {
      if (elem->type == RNN_ETYPE_REG) {
        elem->stride = (long)(elem->width / width);
      }
      else {
        fprintf(_stderr,"%s has non-1 length, but no stride!\n",elem->fullname);
        db->estatus = 1;
      }
    }
    pcVar6 = prefix;
    if (elem->name != (char *)0x0) {
      pcVar6 = elem->fullname;
    }
    preptypeinfo(db,&elem->typeinfo,pcVar6,vi,elem->width,elem->file);
    if (0 < elem->subelemsnum) {
      lVar8 = 0;
      do {
        pcVar6 = prefix;
        if (elem->name != (char *)0x0) {
          pcVar6 = elem->fullname;
        }
        prepdelem(db,elem->subelems[lVar8],pcVar6,vi,width);
        lVar8 = lVar8 + 1;
      } while (lVar8 < elem->subelemsnum);
    }
    pcVar6 = (elem->varinfo).prefix;
    if ((pcVar6 != (char *)0x0) && (elem->name != (char *)0x0)) {
      pcVar6 = catstr(pcVar6,elem->fullname);
      elem->fullname = pcVar6;
    }
  }
  return;
}

Assistant:

static void prepdelem(struct rnndb *db, struct rnndelem *elem, char *prefix, struct rnnvarinfo *parvi, int width) {
	if (elem->type == RNN_ETYPE_USE_GROUP) {
		int i;
		struct rnngroup *gr = 0;
		for (i = 0; i < db->groupsnum; i++)
			if (!strcmp(db->groups[i]->name, elem->name)) {
				gr = db->groups[i];
				break;
			}
		if (gr) {
			for (i = 0; i < gr->subelemsnum; i++)
				ADDARRAY(elem->subelems, copydelem(gr->subelems[i], elem->file));
		} else {
			fprintf (stderr, "group %s not found!\n", elem->name);
			db->estatus = 1;
		}
		elem->type = RNN_ETYPE_STRIPE;
		elem->length = 1;
		elem->name = 0;
	}
	if (elem->name)
		elem->fullname = catstr(prefix, elem->name);
	prepvarinfo (db, elem->fullname?elem->fullname:prefix, &elem->varinfo, parvi);
	if (elem->varinfo.dead)
		return;
	if (elem->length != 1 && !elem->stride) {
		if (elem->type != RNN_ETYPE_REG) {
			fprintf (stderr, "%s has non-1 length, but no stride!\n", elem->fullname);
			db->estatus = 1;
		} else {
			elem->stride = elem->width/width;
		}
	}
	preptypeinfo(db, &elem->typeinfo, elem->name?elem->fullname:prefix, &elem->varinfo, elem->width, elem->file);

	int i;
	for (i = 0; i < elem->subelemsnum; i++)
		prepdelem(db,  elem->subelems[i], elem->name?elem->fullname:prefix, &elem->varinfo, width);
	if (elem->varinfo.prefix && elem->name)
		elem->fullname = catstr(elem->varinfo.prefix, elem->fullname);
}